

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall
r_comp::Compiler::set_arity_error(Compiler *this,Ptr *node,uint16_t expected,uint16_t got)

{
  undefined2 in_register_0000000a;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_110;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::to_string(&local_40,CONCAT22(in_register_0000000a,got));
  std::operator+(&local_e0,"got ",&local_40);
  std::operator+(&local_c0,&local_e0," elements, expected ");
  std::__cxx11::to_string(&local_100,(uint)expected);
  std::operator+(&local_a0,&local_c0,&local_100);
  std::operator+(&local_80,&local_a0," for ");
  std::operator+(&local_60,&local_80,
                 &((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->cmd);
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_110,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  set_error(this,&local_60,(Ptr *)&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Compiler::set_arity_error(RepliStruct::Ptr node, uint16_t expected, uint16_t got)
{
    set_error("got " + std::to_string(got) +
              " elements, expected " + std::to_string(expected) +
              " for " + node->cmd, node);
}